

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::NegativeGLSLCompileTime::Compile
          (NegativeGLSLCompileTime *this,string *source)

{
  GLuint shader;
  CallLogWrapper *this_00;
  GLint status;
  char *src [2];
  GLchar log [1024];
  
  src[0] = "#version 430 core";
  src[1] = (source->_M_dataplus)._M_p;
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,shader,2,src,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glGetShaderInfoLog(this_00,shader,0x400,(GLsizei *)0x0,log);
  anon_unknown_0::Output("Shader Info Log:\n%s\n",log);
  glu::CallLogWrapper::glGetShaderiv(this_00,shader,0x8b81,&status);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  if (status == 1) {
    anon_unknown_0::Output("Compilation should fail.\n");
  }
  return status != 1;
}

Assistant:

bool Compile(const std::string& source)
	{
		const char* const csVer  = "#version 430 core";
		const char* const src[2] = { csVer, source.c_str() };
		const GLuint	  sh	 = glCreateShader(GL_FRAGMENT_SHADER);
		glShaderSource(sh, 2, src, NULL);
		glCompileShader(sh);

		GLchar log[1024];
		glGetShaderInfoLog(sh, sizeof(log), NULL, log);
		Output("Shader Info Log:\n%s\n", log);

		GLint status;
		glGetShaderiv(sh, GL_COMPILE_STATUS, &status);
		glDeleteShader(sh);

		if (status == GL_TRUE)
		{
			Output("Compilation should fail.\n");
			return false;
		}

		return true;
	}